

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

bin_t * arena_bin_choose_lock(tsdn_t *tsdn,arena_t *arena,szind_t binind,uint *binshard)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  bin_t *mutex;
  bin_t *pbVar3;
  uint uVar4;
  int iVar5;
  mutex_prof_data_t *data;
  
  uVar4 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    uVar4 = (uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                  binshard[binind];
  }
  *binshard = uVar4;
  pbVar3 = arena->bins[binind].bin_shards;
  mutex = pbVar3 + uVar4;
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)((long)&pbVar3[uVar4].lock.field_0 + 0x40));
  if (iVar5 != 0) {
    malloc_mutex_lock_slow(&mutex->lock);
    (mutex->lock).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(mutex->lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((mutex->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
    (mutex->lock).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(mutex->lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  return mutex;
}

Assistant:

bin_t *
arena_bin_choose_lock(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    unsigned *binshard) {
	bin_t *bin;
	if (tsdn_null(tsdn) || tsd_arena_get(tsdn_tsd(tsdn)) == NULL) {
		*binshard = 0;
	} else {
		*binshard = tsd_binshardsp_get(tsdn_tsd(tsdn))->binshard[binind];
	}
	assert(*binshard < bin_infos[binind].n_shards);
	bin = &arena->bins[binind].bin_shards[*binshard];
	malloc_mutex_lock(tsdn, &bin->lock);

	return bin;
}